

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall asl::String::replaceme(String *this,char a,char b)

{
  char cVar1;
  char *local_20;
  char *p;
  char b_local;
  char a_local;
  String *this_local;
  
  local_20 = str(this);
  do {
    if (*local_20 == a) {
      *local_20 = b;
    }
    cVar1 = *local_20;
    local_20 = local_20 + 1;
  } while (cVar1 != '\0');
  return this;
}

Assistant:

String& String::replaceme(char a, char b)
{
	char* p = str();
	do {
		if(*p == a)
			*p = b;
	}
	while(*p++);
	return *this;
}